

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O2

void __thiscall
embree::avx::BVHNSubdivPatch1BuilderSAH<4>::build(BVHNSubdivPatch1BuilderSAH<4> *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  undefined8 *puVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Settings settings;
  char cVar14;
  int iVar15;
  size_t sVar16;
  ulong uVar17;
  void *pvVar18;
  long lVar19;
  NodeRef root;
  runtime_error *prVar20;
  size_t i_2;
  ulong uVar21;
  size_t *psVar22;
  ulong uVar23;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *pPVar24;
  size_t i_1;
  size_t sVar25;
  ulong uVar26;
  EVP_PKEY_CTX *ctx;
  ulong uVar27;
  BVHN<4> *pBVar28;
  size_t N;
  ulong uVar29;
  size_t i;
  size_t sVar30;
  ulong uVar31;
  bool bVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar34;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar37;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar38;
  anon_class_1_0_00000001 local_2e21;
  size_t taskCount;
  ulong *local_2e18;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *local_2e10;
  undefined1 local_2e08 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_2df8;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined4 uStack_2dc8;
  undefined4 uStack_2dc4;
  undefined4 uStack_2dc0;
  undefined4 uStack_2dbc;
  undefined1 local_2db8 [16];
  double local_2da0;
  anon_class_8_1_898bcfc2_conflict7 local_2d98;
  Iterator<embree::SubdivMesh,_false> *local_2d90;
  Iterator<embree::SubdivMesh,_false> iter;
  ProgressMonitorClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_subdiv_cpp:92:25)>
  virtualprogress;
  PrimInfo pinfo;
  BVHNBuilderV local_2ce8;
  Iterator<embree::SubdivMesh,_false> *pIStack_2ce0;
  undefined4 local_2cd8;
  undefined4 uStack_2cd4;
  undefined4 uStack_2cd0;
  undefined4 uStack_2ccc;
  undefined4 local_2cc8;
  undefined4 uStack_2cc4;
  undefined4 uStack_2cc0;
  undefined4 uStack_2cbc;
  undefined4 local_2cb8;
  undefined4 uStack_2cb4;
  undefined4 uStack_2cb0;
  undefined4 uStack_2cac;
  undefined1 local_2ca8 [16];
  PrimInfo pinfo3;
  ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  
  sVar25 = (this->scene->world).numSubdivPatches;
  if (sVar25 == 0) {
    if ((this->prims).size_active != 0) {
      (this->prims).size_active = 0;
    }
    (this->prims).size_active = 0;
    pBVar28 = this->bvh;
    pPVar24 = &pstate;
    goto LAB_00ddfaae;
  }
  pBVar28 = this->bvh;
  std::__cxx11::to_string((string *)&local_2df8.field_1,4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                 "avx::BVH",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_2df8.field_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pstate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                 "SubdivPatch1BuilderSAH");
  local_2da0 = BVHN<4>::preBuild(pBVar28,(string *)&pstate);
  std::__cxx11::string::~string((string *)&pstate);
  std::__cxx11::string::~string((string *)&pinfo);
  std::__cxx11::string::~string((string *)&local_2df8.field_1);
  FastAllocator::init_estimate(&this->bvh->alloc,sVar25 << 5);
  virtualprogress.super_BuildProgressMonitor._vptr_BuildProgressMonitor =
       (_func_int **)&PTR_operator___021ed958;
  pstate.super_ParallelForForState.taskCount = 0;
  iter.scene = this->scene;
  pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = &iter;
  iter.all = false;
  sVar25 = ((iter.scene)->geometries).size_active;
  uVar29 = 0;
  local_2e10 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
               this;
  virtualprogress.closure.this = (BVHNSubdivPatch1BuilderSAH<4> *)this;
  for (sVar30 = 0; sVar25 != sVar30; sVar30 = sVar30 + 1) {
    sVar16 = ParallelForForState::init<embree::Scene::Iterator<embree::SubdivMesh,_false>_>::
             anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&pinfo,sVar30);
    uVar29 = uVar29 + sVar16;
  }
  pstate.super_ParallelForForState.N = uVar29;
  iVar15 = tbb::detail::d1::max_concurrency();
  uVar21 = uVar29 + 0x3ff >> 10;
  if ((ulong)(long)iVar15 < uVar21) {
    uVar21 = (long)iVar15;
  }
  uVar17 = 0x40;
  if (uVar21 < 0x40) {
    uVar17 = uVar21;
  }
  sVar25 = 0;
  pstate.super_ParallelForForState.taskCount = uVar17 + (uVar17 == 0);
  pstate.super_ParallelForForState.i0[0] = 0;
  pstate.super_ParallelForForState.j0[0] = 0;
  uVar17 = uVar29 / pstate.super_ParallelForForState.taskCount;
  uVar21 = 1;
  uVar31 = 0;
  while (sVar30 = pstate.super_ParallelForForState.taskCount,
        uVar21 < pstate.super_ParallelForForState.taskCount) {
    sVar30 = ParallelForForState::init<embree::Scene::Iterator<embree::SubdivMesh,_false>_>::
             anon_class_8_1_4d25ca37::operator()((anon_class_8_1_4d25ca37 *)&pinfo,sVar25);
    uVar26 = (uVar21 + 1) * uVar29;
    uVar27 = 0;
    uVar23 = uVar31;
    for (; ((uVar31 = (uVar23 + sVar30) - uVar27, uVar27 < sVar30 && (uVar17 <= uVar31)) &&
           (uVar21 < pstate.super_ParallelForForState.taskCount)); uVar21 = uVar21 + 1) {
      pstate.super_ParallelForForState.i0[uVar21] = sVar25;
      uVar27 = uVar27 + (uVar17 - uVar23);
      pstate.super_ParallelForForState.j0[uVar21] = uVar27;
      uVar31 = uVar26 / pstate.super_ParallelForForState.taskCount;
      uVar26 = uVar26 + uVar29;
      uVar23 = uVar17;
      uVar17 = uVar31;
    }
    sVar25 = sVar25 + 1;
  }
  local_2df8.m128[0] = INFINITY;
  local_2df8.m128[1] = INFINITY;
  local_2df8.m128[2] = INFINITY;
  local_2df8.m128[3] = INFINITY;
  uStack_2de8._0_4_ = 0xff800000;
  uStack_2de8._4_4_ = 0xff800000;
  uStack_2de0._0_4_ = 0xff800000;
  uStack_2de0._4_4_ = 0xff800000;
  uStack_2dd8._0_4_ = 0x7f800000;
  uStack_2dd8._4_4_ = 0x7f800000;
  uStack_2dd0._0_4_ = 0x7f800000;
  uStack_2dd0._4_4_ = 0x7f800000;
  uStack_2dc8 = 0xff800000;
  uStack_2dc4 = 0xff800000;
  uStack_2dc0 = 0xff800000;
  uStack_2dbc = 0xff800000;
  local_2db8 = ZEXT816(0) << 0x20;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
       local_2e08 + 8;
  local_2e08._8_8_ = &iter;
  local_2ce8._vptr_BVHNBuilderV = (_func_int **)local_2e08;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ = &local_2ce8;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = &taskCount;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = &pstate;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ = &local_2e21;
  taskCount = pstate.super_ParallelForForState.taskCount;
  pIStack_2ce0 = (Iterator<embree::SubdivMesh,_false> *)local_2e08._8_8_;
  pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = &local_2df8;
  tbb::detail::d1::task_group_context::task_group_context
            ((task_group_context *)&pinfo,(context_traits)0x4,CUSTOM_CTX);
  local_2d98.func = (anon_class_48_6_afa08d2e_conflict1 *)&pinfo3;
  tbb::detail::d1::
  parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
            (0,sVar30,1,&local_2d98,(task_group_context *)&pinfo);
  cVar14 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&pinfo);
  pPVar24 = local_2e10;
  if (cVar14 != '\0') {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar20,"task cancelled");
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&pinfo);
  aVar33.m128[1] = local_2df8.m128[1];
  aVar33.m128[0] = local_2df8.m128[0];
  aVar33.m128[2] = local_2df8.m128[2];
  aVar33.m128[3] = local_2df8.m128[3];
  aVar34.m128[1] = (float)uStack_2de8._4_4_;
  aVar34.m128[0] = (float)(int)uStack_2de8;
  aVar34.m128[2] = (float)(undefined4)uStack_2de0;
  aVar34.m128[3] = (float)uStack_2de0._4_4_;
  aVar35.m128[1] = (float)uStack_2dd8._4_4_;
  aVar35.m128[0] = (float)(undefined4)uStack_2dd8;
  aVar35.m128[2] = (float)(undefined4)uStack_2dd0;
  aVar35.m128[3] = (float)uStack_2dd0._4_4_;
  aVar36.m128[1] = (float)uStack_2dc4;
  aVar36.m128[0] = (float)uStack_2dc8;
  aVar36.m128[2] = (float)uStack_2dc0;
  aVar36.m128[3] = (float)uStack_2dbc;
  psVar22 = &pstate.prefix_state.sums[0].begin;
  aVar37.m128[2] = INFINITY;
  aVar37._0_8_ = 0x7f8000007f800000;
  aVar37.m128[3] = INFINITY;
  aVar38.m128[2] = -INFINITY;
  aVar38._0_8_ = 0xff800000ff800000;
  aVar38.m128[3] = -INFINITY;
  sVar25 = taskCount;
  auVar5 = local_2db8;
  while (bVar32 = sVar25 != 0, sVar25 = sVar25 - 1, bVar32) {
    (((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar22 + -8))->
    super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar33;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar22 + -6) = aVar34;
    (((BBox3fa *)(psVar22 + -4))->lower).field_0 = aVar35;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar22 + -2) = aVar36;
    *(undefined1 (*) [16])psVar22 = auVar5;
    auVar5 = vpaddq_avx(auVar5,*(undefined1 (*) [16])(psVar22 + -0x280));
    psVar22 = psVar22 + 10;
    aVar33 = aVar37;
    aVar34 = aVar38;
    aVar35 = aVar37;
    aVar36 = aVar38;
  }
  if (auVar5._0_8_ != 0) {
    uVar29 = *(ulong *)((long)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 3) + 8);
    uVar17 = vpextrq_avx(auVar5,1);
    uVar21 = uVar29;
    if ((uVar29 < uVar17) && (uVar31 = uVar29, uVar21 = uVar17, uVar29 != 0)) {
      for (; uVar21 = uVar31, uVar31 < uVar17; uVar31 = uVar31 * 2 + (ulong)(uVar31 * 2 == 0)) {
      }
    }
    local_2e18 = (ulong *)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 3);
    if (uVar17 < *(ulong *)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 3)) {
      *local_2e18 = uVar17;
    }
    if (uVar29 == uVar21) {
      *local_2e18 = uVar17;
    }
    else {
      pvVar2 = ((RefCount *)(pPVar24->super_ParallelForForState).i0)[4]._vptr_RefCount;
      if (uVar21 == 0) {
        sVar25 = 0;
LAB_00ddf794:
        pvVar18 = alignedMalloc(sVar25,0x20);
      }
      else {
        puVar3 = ((RefCount *)(pPVar24->super_ParallelForForState).i0)[2]._vptr_RefCount;
        sVar25 = uVar21 << 5;
        (**(code **)*puVar3)(puVar3,sVar25,0);
        if (sVar25 < 0x1c00000) goto LAB_00ddf794;
        pvVar18 = os_malloc(sVar25,(bool *)((long)((RefCount *)
                                                   (pPVar24->super_ParallelForForState).i0 + 2) + 8)
                           );
      }
      ((RefCount *)(pPVar24->super_ParallelForForState).i0)[4]._vptr_RefCount = pvVar18;
      lVar19 = 0;
      for (uVar29 = 0; uVar29 < *local_2e18; uVar29 = uVar29 + 1) {
        puVar3 = (undefined8 *)((long)pvVar2 + lVar19);
        uVar6 = puVar3[1];
        uVar7 = puVar3[2];
        uVar8 = puVar3[3];
        puVar1 = (undefined8 *)
                 (*(long *)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 4) + lVar19);
        *puVar1 = *puVar3;
        puVar1[1] = uVar6;
        puVar1[2] = uVar7;
        puVar1[3] = uVar8;
        lVar19 = lVar19 + 0x20;
      }
      lVar19 = *(long *)((long)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 3) + 8);
      if (pvVar2 != (void *)0x0) {
        if ((ulong)(lVar19 << 5) < 0x1c00000) {
          alignedFree(pvVar2);
        }
        else {
          os_free(pvVar2,lVar19 << 5,
                  *(bool *)((long)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 2) + 8));
        }
      }
      if (lVar19 != 0) {
        puVar3 = ((RefCount *)(pPVar24->super_ParallelForForState).i0)[2]._vptr_RefCount;
        (**(code **)*puVar3)(puVar3,lVar19 * -0x20,1);
      }
      *(ulong *)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 3) = uVar17;
      *(ulong *)((long)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 3) + 8) = uVar21;
    }
    sVar25 = pstate.super_ParallelForForState.taskCount;
    if (uVar17 != 0) {
      local_2ce8._vptr_BVHNBuilderV = (_func_int **)0x7f8000007f800000;
      pIStack_2ce0 = (Iterator<embree::SubdivMesh,_false> *)0x7f8000007f800000;
      local_2cd8 = 0xff800000;
      uStack_2cd4 = 0xff800000;
      uStack_2cd0 = 0xff800000;
      uStack_2ccc = 0xff800000;
      local_2cc8 = 0x7f800000;
      uStack_2cc4 = 0x7f800000;
      uStack_2cc0 = 0x7f800000;
      uStack_2cbc = 0x7f800000;
      local_2cb8 = 0xff800000;
      uStack_2cb4 = 0xff800000;
      uStack_2cb0 = 0xff800000;
      uStack_2cac = 0xff800000;
      local_2ca8 = ZEXT816(0) << 0x20;
      local_2e08._0_8_ = pPVar24;
      local_2e08._8_8_ = &iter;
      local_2d98.func = (anon_class_48_6_afa08d2e_conflict1 *)local_2e08;
      taskCount = pstate.super_ParallelForForState.taskCount;
      local_2df8._0_8_ = &pstate;
      local_2df8._8_8_ = &taskCount;
      uStack_2de8 = (anon_class_1_0_00000001 *)&local_2ce8;
      uStack_2dd8 = &local_2e21;
      uStack_2dd0 = &local_2d98;
      local_2d90 = (Iterator<embree::SubdivMesh,_false> *)local_2e08._8_8_;
      uStack_2de0 = (anon_class_16_2_341d598e_conflict1 *)(local_2e08 + 8);
      tbb::detail::d1::task_group_context::task_group_context
                ((task_group_context *)&pinfo,(context_traits)0x4,CUSTOM_CTX);
      pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
           &local_2df8;
      tbb::detail::d1::
      parallel_for<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh____builders_______common_algorithms_parallel_for_h:32:43)>
                (0,sVar25,1,(anon_class_8_1_898bcfc2_conflict7 *)&pinfo3,
                 (task_group_context *)&pinfo);
      cVar14 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)&pinfo);
      if (cVar14 == '\0') {
        tbb::detail::d1::task_group_context::~task_group_context((task_group_context *)&pinfo);
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
             CONCAT44(uStack_2cb4,local_2cb8);
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
             CONCAT44(uStack_2cac,uStack_2cb0);
        pinfo3.begin = local_2ca8._0_8_;
        pinfo3.end = local_2ca8._8_8_;
        psVar22 = &pstate.prefix_state.sums[0].begin;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
             local_2ce8._vptr_BVHNBuilderV;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
             pIStack_2ce0;
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
             (anon_class_1_0_00000001 *)CONCAT44(uStack_2cd4,local_2cd8);
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
             (anon_class_16_2_341d598e_conflict1 *)CONCAT44(uStack_2ccc,uStack_2cd0);
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
             (anon_class_1_0_00000001 *)CONCAT44(uStack_2cc4,local_2cc8);
        pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
             (anon_class_8_1_898bcfc2_conflict7 *)CONCAT44(uStack_2cbc,uStack_2cc0);
        for (uVar29 = 0; pPVar24 = local_2e10,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_,
            pinfo3.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
                 pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_,
            uVar29 < taskCount; uVar29 = uVar29 + 1) {
          uVar6 = psVar22[-0x288];
          uVar7 = psVar22[-0x287];
          uVar8 = psVar22[-0x286];
          uVar9 = psVar22[-0x285];
          uVar10 = psVar22[-0x284];
          uVar11 = psVar22[-0x283];
          uVar12 = psVar22[-0x282];
          uVar13 = psVar22[-0x281];
          pinfo.begin = psVar22[-0x280];
          pinfo.end = psVar22[-0x27f];
          *(undefined8 *)
           &(((PrimInfoT<embree::BBox<embree::Vec3fa>_> *)(psVar22 + -8))->
            super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
               pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_;
          psVar22[-7] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0
                        ._8_8_;
          *(undefined8 *)&((Vec3fa *)(psVar22 + -6))->field_0 =
               pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_;
          psVar22[-5] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0
                        ._8_8_;
          *(undefined8 *)&(((BBox3fa *)(psVar22 + -4))->lower).field_0 =
               pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_;
          psVar22[-3] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0
                        ._8_8_;
          *(undefined8 *)&((Vec3fa *)(psVar22 + -2))->field_0 =
               pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_;
          psVar22[-1] = pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0
                        ._8_8_;
          *psVar22 = pinfo3.begin;
          psVar22[1] = pinfo3.end;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ = uVar6
          ;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ = uVar7
          ;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ = uVar8
          ;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ = uVar9
          ;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
               uVar10;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
               uVar11;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
               uVar12;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
               uVar13;
          build::anon_class_1_0_00000001::operator()
                    ((PrimInfo *)&local_2df8.field_1,&local_2e21,&pinfo3,&pinfo);
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._0_8_ =
               CONCAT44(uStack_2dc4,uStack_2dc8);
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.upper.field_0._8_8_ =
               CONCAT44(uStack_2dbc,uStack_2dc0);
          pinfo3.begin = local_2db8._0_8_;
          pinfo3.end = local_2db8._8_8_;
          psVar22 = psVar22 + 10;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._0_8_ =
               local_2df8._0_8_;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0._8_8_ =
               local_2df8._8_8_;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_ =
               uStack_2de8;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_ =
               uStack_2de0;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._0_8_ =
               uStack_2dd8;
          pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.centBounds.lower.field_0._8_8_ =
               uStack_2dd0;
        }
        pinfo.begin = 0;
        pinfo.end = pinfo3.end;
        for (uStack_2de8._0_4_ = 0x1f; 4U >> (int)uStack_2de8 == 0;
            uStack_2de8._0_4_ = (int)uStack_2de8 + -1) {
        }
        local_2df8.m128[0] = 2.8026e-45;
        local_2df8.m128[1] = 0.0;
        local_2df8.m128[2] = 4.48416e-44;
        local_2df8.m128[3] = 0.0;
        uStack_2de8._4_4_ = (int)uStack_2de8 >> 0x1f;
        uStack_2de0._0_4_ = 1;
        uStack_2de0._4_4_ = 0;
        uStack_2dd8._0_4_ = 1;
        uStack_2dd8._4_4_ = 0;
        uStack_2dd0._0_4_ = 0x3f800000;
        uStack_2dd0._4_4_ = 0x3f800000;
        uStack_2dc8 = 0x400;
        uStack_2dc4 = 0;
        uStack_2dc0 = 0xffffffff;
        uStack_2dbc = 0xffffffff;
        local_2ce8._vptr_BVHNBuilderV = (_func_int **)&PTR_createLeaf_021eda18;
        settings.maxDepth = 0x20;
        settings.branchingFactor = 2;
        settings.logBlockSize = (long)(int)uStack_2de8;
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0;
        settings.intCost = 1.0;
        settings.singleThreadThreshold = 0x400;
        settings.primrefarrayalloc = 0xffffffffffffffff;
        root = BVHNBuilderVirtual<4>::BVHNBuilderV::build
                         (&local_2ce8,
                          (FastAllocator *)
                          (*(long *)((RefCount *)(local_2e10->super_ParallelForForState).i0 + 1) +
                          0x78),&virtualprogress.super_BuildProgressMonitor,
                          *(PrimRef **)((RefCount *)(local_2e10->super_ParallelForForState).i0 + 4),
                          &pinfo,settings);
        local_2df8.m128[0] =
             (float)pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.
                    _0_8_;
        local_2df8.m128[1] =
             (float)((ulong)pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                            field_0._0_8_ >> 0x20);
        local_2df8.m128[2] =
             (float)pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.field_0.
                    _8_8_;
        local_2df8.m128[3] =
             (float)((ulong)pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.lower.
                            field_0._8_8_ >> 0x20);
        uStack_2de8._0_4_ =
             (int)pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._0_8_
        ;
        uStack_2de8._4_4_ =
             (int)((ulong)pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.
                          field_0._0_8_ >> 0x20);
        uStack_2de0._0_4_ =
             (undefined4)
             pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0._8_8_;
        uStack_2de0._4_4_ =
             (undefined4)
             ((ulong)pinfo.super_CentGeom<embree::BBox<embree::Vec3fa>_>.geomBounds.upper.field_0.
                     _8_8_ >> 0x20);
        uStack_2dd8._0_4_ = local_2df8.m128[0];
        uStack_2dd8._4_4_ = local_2df8.m128[1];
        uStack_2dd0._0_4_ = local_2df8.m128[2];
        uStack_2dd0._4_4_ = local_2df8.m128[3];
        uStack_2dc8 = (int)uStack_2de8;
        uStack_2dc4 = uStack_2de8._4_4_;
        uStack_2dc0 = (undefined4)uStack_2de0;
        uStack_2dbc = uStack_2de0._4_4_;
        BVHN<4>::set(*(BVHN<4> **)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 1),
                     (NodeRef)root.ptr,(LBBox3fa *)&local_2df8.field_1,pinfo.end - pinfo.begin);
        fVar4 = (float)(pinfo.end - pinfo.begin) * 0.005;
        uVar29 = (ulong)fVar4;
        ctx = (EVP_PKEY_CTX *)((long)(fVar4 - 9.223372e+18) & (long)uVar29 >> 0x3f | uVar29);
        BVHN<4>::layoutLargeNodes
                  (*(BVHN<4> **)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 1),
                   (size_t)ctx);
        if ((*(byte *)(*(long *)((long)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 1) + 8
                                ) + 0x238) & 1) == 0) {
          lVar19 = *(long *)((long)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 3) + 8);
          pvVar2 = ((RefCount *)(pPVar24->super_ParallelForForState).i0)[4]._vptr_RefCount;
          if (pvVar2 != (void *)0x0) {
            ctx = (EVP_PKEY_CTX *)(lVar19 << 5);
            if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
              alignedFree(pvVar2);
            }
            else {
              os_free(pvVar2,(size_t)ctx,
                      *(bool *)((long)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 2) + 8)
                     );
            }
          }
          if (lVar19 != 0) {
            puVar3 = ((RefCount *)(pPVar24->super_ParallelForForState).i0)[2]._vptr_RefCount;
            ctx = (EVP_PKEY_CTX *)(lVar19 * -0x20);
            (**(code **)*puVar3)(puVar3,ctx,1);
          }
          *local_2e18 = 0;
          local_2e18[1] = 0;
          local_2e18[2] = 0;
        }
        BVHN<4>::cleanup(*(BVHN<4> **)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 1),ctx)
        ;
        BVHN<4>::postBuild(*(BVHN<4> **)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 1),
                           local_2da0);
        return;
      }
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar20,"task cancelled");
      __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pBVar28 = *(BVHN<4> **)((RefCount *)(pPVar24->super_ParallelForForState).i0 + 1);
  pPVar24 = (ParallelForForPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> *)
            &pinfo;
LAB_00ddfaae:
  (((Vec3fa *)(pPVar24->super_ParallelForForState).i0)->field_0).m128[0] = INFINITY;
  (((Vec3fa *)(pPVar24->super_ParallelForForState).i0)->field_0).m128[1] = INFINITY;
  (((Vec3fa *)(pPVar24->super_ParallelForForState).i0)->field_0).m128[2] = INFINITY;
  (((Vec3fa *)(pPVar24->super_ParallelForForState).i0)->field_0).m128[3] = INFINITY;
  ((Vec3fa *)(pPVar24->super_ParallelForForState).i0)[1].field_0.m128[0] = -INFINITY;
  ((Vec3fa *)(pPVar24->super_ParallelForForState).i0)[1].field_0.m128[1] = -INFINITY;
  ((Vec3fa *)(pPVar24->super_ParallelForForState).i0)[1].field_0.m128[2] = -INFINITY;
  ((Vec3fa *)(pPVar24->super_ParallelForForState).i0)[1].field_0.m128[3] = -INFINITY;
  *(undefined4 *)((Vec3fa *)(pPVar24->super_ParallelForForState).i0 + 2) = 0x7f800000;
  *(undefined4 *)((long)((Vec3fa *)(pPVar24->super_ParallelForForState).i0 + 2) + 4) = 0x7f800000;
  *(undefined4 *)((long)((Vec3fa *)(pPVar24->super_ParallelForForState).i0 + 2) + 8) = 0x7f800000;
  *(undefined4 *)((long)((Vec3fa *)(pPVar24->super_ParallelForForState).i0 + 2) + 0xc) = 0x7f800000;
  *(undefined4 *)((Vec3fa *)(pPVar24->super_ParallelForForState).i0 + 3) = 0xff800000;
  *(undefined4 *)((long)((Vec3fa *)(pPVar24->super_ParallelForForState).i0 + 3) + 4) = 0xff800000;
  *(undefined4 *)((long)((Vec3fa *)(pPVar24->super_ParallelForForState).i0 + 3) + 8) = 0xff800000;
  *(undefined4 *)((long)((Vec3fa *)(pPVar24->super_ParallelForForState).i0 + 3) + 0xc) = 0xff800000;
  BVHN<4>::set(pBVar28,(NodeRef)0x8,(LBBox3fa *)pPVar24,0);
  return;
}

Assistant:

void build() 
      {
        /* skip build for empty scene */
        const size_t numPrimitives = scene->getNumPrimitives(SubdivMesh::geom_type,false);
        if (numPrimitives == 0) {
          prims.resize(numPrimitives);
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }
 
        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "SubdivPatch1BuilderSAH");

        //bvh->alloc.reset();
        bvh->alloc.init_estimate(numPrimitives*sizeof(PrimRef));

        auto progress = [&] (size_t dn) { bvh->scene->progressMonitor(double(dn)); };
        auto virtualprogress = BuildProgressMonitorFromClosure(progress);

        ParallelForForPrefixSumState<PrimInfo> pstate;
        
        /* initialize allocator and parallel_for_for_prefix_sum */
        Scene::Iterator<SubdivMesh> iter(scene);
        pstate.init(iter,size_t(1024));

        PrimInfo pinfo1 = parallel_for_for_prefix_sum0( pstate, iter, PrimInfo(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t /*geomID*/) -> PrimInfo
        { 
          size_t p = 0;
          size_t g = 0;
          for (size_t f=r.begin(); f!=r.end(); ++f) {          
            if (!mesh->valid(f)) continue;
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              float level[4]; SubdivPatch1Base::computeEdgeLevels(edge_level,subdiv,level);
              Vec2i grid = SubdivPatch1Base::computeGridSize(level);
              size_t num = getNumEagerLeaves(grid.x,grid.y);
              g+=num;
              p++;
            });
          }
          return PrimInfo(p,g,empty);
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo(a.begin+b.begin,a.end+b.end,empty); });
        size_t numSubPatches = pinfo1.begin;
        if (numSubPatches == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        prims.resize(pinfo1.end);
        if (pinfo1.end == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        PrimInfo pinfo3 = parallel_for_for_prefix_sum1( pstate, iter, PrimInfo(empty), [&](SubdivMesh* mesh, const range<size_t>& r, size_t k, size_t geomID, const PrimInfo& base) -> PrimInfo
        {
          Allocator alloc = bvh->alloc.getCachedAllocator();
          
          PrimInfo s(empty);
          for (size_t f=r.begin(); f!=r.end(); ++f) {
            if (!mesh->valid(f)) continue;
            
            patch_eval_subdivision(mesh->getHalfEdge(0,f),[&](const Vec2f uv[4], const int subdiv[4], const float edge_level[4], int subPatch)
            {
              SubdivPatch1Base patch(unsigned(geomID),unsigned(f),subPatch,mesh,0,uv,edge_level,subdiv,VSIZEX);
              size_t num = createEager(patch,scene,mesh,unsigned(f),alloc,&prims[base.end+s.end]);
              assert(num == getNumEagerLeaves(patch.grid_u_res,patch.grid_v_res));
              for (size_t i=0; i<num; i++)
                s.add_center2(prims[base.end+s.end]);
              s.begin++;
            });
          }
          return s;
        }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a, b); });

        PrimInfo pinfo(0,pinfo3.end,pinfo3);
        
        auto createLeaf = [&] (const PrimRef* prims, const range<size_t>& range, Allocator alloc) -> NodeRef {
          assert(range.size() == 1);
          size_t leaf = (size_t) prims[range.begin()].ID();
          return NodeRef(leaf);
        };

        /* settings for BVH build */
        GeneralBVHBuilder::Settings settings;
        settings.logBlockSize = bsr(N);
        settings.minLeafSize = 1;
        settings.maxLeafSize = 1;
        settings.travCost = 1.0f;
        settings.intCost = 1.0f;
        settings.singleThreadThreshold = DEFAULT_SINGLE_THREAD_THRESHOLD;

        NodeRef root = BVHNBuilderVirtual<N>::build(&bvh->alloc,createLeaf,virtualprogress,prims.data(),pinfo,settings);
        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));
        
	/* clear temporary data for static geometry */
	if (scene->isStaticAccel()) {
          prims.clear();
        }
        bvh->cleanup();
        bvh->postBuild(t0);
      }